

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableMessageFieldGenerator::GenerateParsingCode
          (RepeatedImmutableMessageFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  Printer *printer_local;
  RepeatedImmutableMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = new java.util.ArrayList<$type$>();\n  $set_mutable_bit_parser$;\n}\n"
                    );
  TVar1 = GetType(this->descriptor_);
  if (TVar1 == TYPE_GROUP) {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_.add(input.readGroup($number$, $type$.$get_parser$,\n    extensionRegistry));\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "$name$_.add(\n    input.readMessage($type$.$get_parser$, extensionRegistry));\n"
                      );
  }
  return;
}

Assistant:

void RepeatedImmutableMessageFieldGenerator::GenerateParsingCode(
    io::Printer* printer) const {
  printer->Print(variables_,
                 "if (!$get_mutable_bit_parser$) {\n"
                 "  $name$_ = new java.util.ArrayList<$type$>();\n"
                 "  $set_mutable_bit_parser$;\n"
                 "}\n");

  if (GetType(descriptor_) == FieldDescriptor::TYPE_GROUP) {
    printer->Print(
        variables_,
        "$name$_.add(input.readGroup($number$, $type$.$get_parser$,\n"
        "    extensionRegistry));\n");
  } else {
    printer->Print(
        variables_,
        "$name$_.add(\n"
        "    input.readMessage($type$.$get_parser$, extensionRegistry));\n");
  }
}